

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O0

int getESICnt(string *esiStr)

{
  int iVar1;
  bool bVar2;
  istream *piVar3;
  string *in_RDI;
  string num;
  int esiCnt;
  istringstream ss;
  string local_1b0 [36];
  int local_18c;
  istringstream local_188 [392];
  
  std::__cxx11::istringstream::istringstream(local_188,in_RDI,_S_in);
  local_18c = 0;
  std::__cxx11::string::string(local_1b0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_188,local_1b0,',');
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    iVar1 = local_18c;
    if (!bVar2) break;
    local_18c = local_18c + 1;
  }
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::istringstream::~istringstream(local_188);
  return iVar1;
}

Assistant:

int getESICnt (string esiStr) {

    istringstream ss(esiStr);
    int esiCnt = 0;
    string num;
    while (getline(ss, num, ',')) {
        esiCnt++;
    }

    return esiCnt;

}